

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getCenterOfMassVelocity
          (KinDynComputations *this,Span<double,__1L> vel)

{
  index_type iVar1;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  bool ok;
  int expected_velocity_size;
  KinDynComputations *in_stack_00000130;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff78;
  VectorFixSize<3U> *in_stack_ffffffffffffff98;
  storage_type<iDynTree::details::extent_type<_1L>_> in_stack_ffffffffffffffa0;
  
  iVar1 = Span<double,_-1L>::size((Span<double,__1L> *)0x1cd3c2);
  if (iVar1 == 3) {
    getCenterOfMassVelocity(in_stack_00000130);
    toEigen<3U>(in_stack_ffffffffffffff98);
    toEigen((Span<double,__1L>)in_stack_ffffffffffffffa0);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              (in_RDI,in_stack_ffffffffffffff78);
  }
  else {
    iDynTree::reportError("KinDynComputations","getCenterOfMassVelocity","Wrong size in input vel");
  }
  return iVar1 == 3;
}

Assistant:

bool KinDynComputations::getCenterOfMassVelocity(Span<double> vel)
{
    constexpr int expected_velocity_size = 3;
    bool ok = vel.size() == expected_velocity_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCenterOfMassVelocity","Wrong size in input vel");
        return false;
    }

    toEigen(vel) = toEigen(getCenterOfMassVelocity());

    return true;
}